

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

int __thiscall cmComputeLinkDepends::ComputeComponentCount(cmComputeLinkDepends *this,NodeList *nl)

{
  int *piVar1;
  cmGeneratorTarget *this_00;
  cmLinkInterface *pcVar2;
  uint uVar3;
  int *piVar4;
  
  piVar1 = (nl->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 2;
  for (piVar4 = (nl->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    this_00 = (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar4].Target;
    if (this_00 != (cmGeneratorTarget *)0x0) {
      pcVar2 = cmGeneratorTarget::GetLinkInterface(this_00,&this->Config,this->Target);
      if (pcVar2 != (cmLinkInterface *)0x0) {
        if (uVar3 < pcVar2->Multiplicity) {
          uVar3 = pcVar2->Multiplicity;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int cmComputeLinkDepends::ComputeComponentCount(NodeList const& nl)
{
  unsigned int count = 2;
  for (int ni : nl) {
    if (cmGeneratorTarget const* target = this->EntryList[ni].Target) {
      if (cmLinkInterface const* iface =
            target->GetLinkInterface(this->Config, this->Target)) {
        if (iface->Multiplicity > count) {
          count = iface->Multiplicity;
        }
      }
    }
  }
  return count;
}